

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O3

BasicBlock * __thiscall spvtools::opt::CFG::SplitLoopHeader(CFG *this,BasicBlock *bb)

{
  IRContext *pIVar1;
  pointer puVar2;
  pointer puVar3;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> this_00;
  pointer pOVar4;
  iterator iVar5;
  _func_int **pp_Var6;
  mapped_type pLVar7;
  Function *this_01;
  pointer node;
  char cVar8;
  PodType label_id;
  uint32_t uVar9;
  uint32_t uVar10;
  array<signed_char,_4UL> aVar11;
  Instruction *pIVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar13;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var14;
  Function *pFVar15;
  mapped_type *ppBVar16;
  mapped_type *pmVar17;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __dest;
  LoopDescriptor *pLVar18;
  const_iterator cVar19;
  mapped_type *ppLVar20;
  pointer puVar21;
  pointer puVar22;
  Instruction **ppIVar23;
  long lVar24;
  pointer puVar25;
  CFG *pCVar26;
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *this_02;
  ulong uVar27;
  ulong uVar28;
  Loop *loop;
  Loop *pLVar29;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> _Var30;
  Loop *loop_2;
  Instruction *pIVar31;
  Loop *pLVar32;
  IRContext *context;
  string message;
  size_type __dnew;
  IRContext *local_d8;
  CFG *local_d0;
  undefined1 local_c8 [8];
  undefined1 local_c0 [8];
  undefined1 local_b8 [16];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_a8;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_a0;
  undefined1 local_98 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_78;
  int local_6c [3];
  initializer_list<spvtools::opt::Operand> local_60;
  Function *local_50;
  pointer local_48;
  pointer local_40;
  iterator local_38;
  
  pIVar12 = BasicBlock::GetLoopMergeInst(bb);
  if (pIVar12 == (Instruction *)0x0) {
    __assert_fail("bb->GetLoopMergeInst() && \"Expecting bb to be the header of a loop.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                  ,0xc1,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
  }
  pFVar15 = bb->function_;
  pIVar1 = this->module_->context_;
  local_d8 = pIVar1;
  label_id.data._M_elems =
       (array<signed_char,_4UL>)
       Module::TakeNextIdBound
                 ((pIVar1->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((label_id.data._M_elems == (_Type)0x0) &&
     ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_98._0_4_ = (array<signed_char,_4UL>)0x25;
    local_98._4_4_ = (array<signed_char,_4UL>)0x0;
    local_c8 = (undefined1  [8])local_b8;
    local_c8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_c8,(ulong)local_98);
    local_b8._0_8_ = local_98._0_8_;
    (((key_type)local_c8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
    _vptr_IntrusiveNodeBase = (_func_int **)0x667265766f204449;
    (((key_type)local_c8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
         (Instruction *)0x797254202e776f6c;
    (((key_type)local_c8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
         (Instruction *)0x676e696e6e757220;
    (((key_type)local_c8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ = true;
    (((key_type)local_c8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x19 = 'c';
    (((key_type)local_c8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1a = 'o';
    (((key_type)local_c8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1b = 'm';
    (((key_type)local_c8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1c = 'p';
    (((key_type)local_c8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1d = 'a';
    (((key_type)local_c8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1e = 'c';
    (((key_type)local_c8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1f = 't';
    *(undefined8 *)
     &(((key_type)local_c8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1d =
         0x2e7364692d746361;
    local_c0 = (undefined1  [8])local_98._0_8_;
    *(char *)((long)&(((key_type)local_c8)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                     _vptr_IntrusiveNodeBase + local_98._0_8_) = '\0';
    local_98._0_8_ = (_func_int **)0x0;
    local_98._8_8_ = (Instruction *)0x0;
    local_98._16_4_ = (array<signed_char,_4UL>)0x0;
    local_98._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_98,(char *)local_c8);
    if (local_c8 != (undefined1  [8])local_b8) {
      operator_delete((void *)local_c8,local_b8._0_8_ + 1);
    }
    return (BasicBlock *)0x0;
  }
  if (label_id.data._M_elems == (_Type)0x0) {
    return (BasicBlock *)0x0;
  }
  puVar22 = (pFVar15->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (pFVar15->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar27 = (long)puVar2 - (long)puVar22;
  if (0 < (long)uVar27 >> 5) {
    puVar21 = (pointer)((long)&(puVar22->_M_t).
                               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>.
                               _M_head_impl + (uVar27 & 0xffffffffffffffe0));
    lVar24 = ((long)uVar27 >> 5) + 1;
    puVar22 = puVar22 + 2;
    do {
      if (puVar22[-2]._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl == bb) {
        puVar22 = puVar22 + -2;
        goto LAB_0056d73e;
      }
      if (puVar22[-1]._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl == bb) {
        puVar22 = puVar22 + -1;
        goto LAB_0056d73e;
      }
      if ((puVar22->_M_t).
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl == bb)
      goto LAB_0056d73e;
      if (puVar22[1]._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl == bb) {
        puVar22 = puVar22 + 1;
        goto LAB_0056d73e;
      }
      lVar24 = lVar24 + -1;
      puVar22 = puVar22 + 4;
    } while (1 < lVar24);
    uVar27 = (long)puVar2 - (long)puVar21;
    puVar22 = puVar21;
  }
  lVar24 = (long)uVar27 >> 3;
  if (lVar24 == 1) {
LAB_0056d71c:
    if ((puVar22->_M_t).
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl != bb)
    goto LAB_0056e0d8;
  }
  else if (lVar24 == 2) {
LAB_0056d713:
    if ((puVar22->_M_t).
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl != bb) {
      puVar22 = puVar22 + 1;
      goto LAB_0056d71c;
    }
  }
  else {
    if (lVar24 != 3) goto LAB_0056e0d8;
    if ((puVar22->_M_t).
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl != bb) {
      puVar22 = puVar22 + 1;
      goto LAB_0056d713;
    }
  }
LAB_0056d73e:
  if (puVar22 == puVar2) {
LAB_0056e0d8:
    __assert_fail("header_it != fn->end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                  ,0xd1,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
  }
  pIVar12 = (bb->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar9 = 0;
  if (pIVar12->has_result_id_ == true) {
    uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  local_d0 = this;
  pvVar13 = preds(this,uVar9);
  if (puVar22 ==
      (pFVar15->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0056e0b9:
    __assert_fail("latch_block_iter != fn->end() && \"Could not find the latch.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                  ,0xdf,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
  }
  puVar25 = (pvVar13->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    puVar3 = (pvVar13->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    this_00._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (((puVar22->_M_t).
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->label_)._M_t;
    uVar9 = 0;
    if (*(bool *)((long)this_00._M_t.
                        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                 0x2d) == true) {
      uVar9 = Instruction::GetSingleWordOperand
                        ((Instruction *)
                         this_00._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
                         (uint)*(bool *)((long)this_00._M_t.
                                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                               .
                                               super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>
                                               ._M_head_impl + 0x2c));
    }
    local_c8._0_4_ = uVar9;
    _Var14 = std::
             __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                       (puVar3,puVar25,local_c8);
    pCVar26 = local_d0;
    puVar25 = (pvVar13->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    puVar2 = (pFVar15->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  } while ((_Var14._M_current == puVar25) && (puVar22 = puVar22 + 1, puVar22 != puVar2));
  if (puVar22 == puVar2) goto LAB_0056e0b9;
  _Var30._M_head_impl =
       (puVar22->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  RemoveSuccessorEdges(local_d0,bb);
  local_48 = (pointer)&(bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                       super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  ppIVar23 = (Instruction **)local_48;
  do {
    local_38.super_iterator.node_ = (iterator)*ppIVar23;
    ppIVar23 = &(((Instruction *)local_38.super_iterator.node_)->
                super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while (((Instruction *)local_38.super_iterator.node_)->opcode_ == OpPhi);
  pFVar15 = (Function *)
            BasicBlock::SplitBasicBlock(bb,local_d8,(uint32_t)label_id.data._M_elems,&local_38);
  if ((local_d8->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::AnalyzeInstDefUse
              ((local_d8->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               *(Instruction **)
                &((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   *)&pFVar15->params_)->_M_t);
  }
  RegisterBlock(pCVar26,(BasicBlock *)pFVar15);
  local_c8 = *(undefined1 (*) [8])
              &((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 *)&pFVar15->params_)->_M_t;
  if ((local_d8->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    ppBVar16 = std::__detail::
               _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_d8->instr_to_block_,(key_type *)local_c8);
    *ppBVar16 = (mapped_type)pFVar15;
  }
  local_c8 = (undefined1  [8])local_98;
  local_98._8_8_ = local_d8;
  local_98._24_8_ =
       std::
       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:243:27)>
       ::_M_invoke;
  local_98._16_8_ =
       std::
       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:243:27)>
       ::_M_manager;
  local_c0 = (undefined1  [8])0x0;
  local_b8._8_8_ =
       std::
       _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
       ::_M_invoke;
  local_b8._0_8_ =
       std::
       _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
       ::_M_manager;
  pIVar12 = *(Instruction **)
             &((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&pFVar15->params_)->_M_t;
  local_98._0_8_ = pFVar15;
  if ((pIVar12 != (Instruction *)0x0) &&
     (local_60._M_array = (iterator)pIVar12,
     (local_d8->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone)) {
    ppBVar16 = std::__detail::
               _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_d8->instr_to_block_,(key_type *)&local_60);
    *ppBVar16 = (mapped_type)pFVar15;
  }
  pIVar12 = *(Instruction **)
             &(pFVar15->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>;
  if ((pIVar12 != (Instruction *)0x0) &&
     ((pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar12 == (Instruction *)0x0) break;
      pIVar31 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      local_60._M_array = (iterator)pIVar12;
      if ((PodType  [2])local_b8._0_8_ == (PodType  [2])0x0) goto LAB_0056e076;
      if ((pIVar31->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar31 = (Instruction *)0x0;
      }
      cVar8 = (*(code *)local_b8._8_8_)(local_c8,&local_60);
      pIVar12 = pIVar31;
    } while (cVar8 != '\0');
  }
  if ((PodType  [2])local_b8._0_8_ != (PodType  [2])0x0) {
    (*(code *)local_b8._0_8_)(local_c8,local_c8,3);
  }
  if ((PodType  [2])local_98._16_8_ != (PodType  [2])0x0) {
    (*(code *)local_98._16_8_)(local_98,local_98,3);
  }
  pCVar26 = local_d0;
  if (_Var30._M_head_impl == bb) {
    uVar9 = BasicBlock::ContinueBlockId((BasicBlock *)pFVar15);
    pIVar12 = (bb->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar10 = 0;
    if (pIVar12->has_result_id_ == true) {
      uVar10 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
    }
    pCVar26 = local_d0;
    _Var30._M_head_impl = (BasicBlock *)pFVar15;
    if (uVar9 == uVar10) {
      pIVar12 = BasicBlock::GetLoopMergeInst((BasicBlock *)pFVar15);
      local_b8._8_8_ = local_b8;
      local_c8 = (undefined1  [8])&PTR__SmallVector_00930a20;
      local_a8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_b8._0_4_ = label_id.data._M_elems;
      local_c0 = (undefined1  [8])0x1;
      uVar27 = (ulong)(pIVar12->has_result_id_ & 1) + 1;
      if (pIVar12->has_type_id_ == false) {
        uVar27 = (ulong)pIVar12->has_result_id_;
      }
      uVar27 = uVar27 + 1;
      pOVar4 = (pIVar12->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar28 = ((long)(pIVar12->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4 >> 4) *
               -0x5555555555555555;
      if (uVar28 < uVar27 || uVar28 - uVar27 == 0) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2b8,
                      "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                     );
      }
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)&((OperandData *)((pOVar4->words).buffer + -4))->_vptr_SmallVector +
                 (ulong)(uint)((int)uVar27 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_c8);
      local_c8 = (undefined1  [8])&PTR__SmallVector_00930a20;
      if (local_a8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_a8,local_a8._M_head_impl);
      }
    }
  }
  pIVar1 = local_d8;
  local_98._8_8_ = (IRContext *)0x0;
  local_98._0_8_ = operator_new(0x20);
  (((Function *)local_98._0_8_)->def_inst_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (Instruction *)_Var30._M_head_impl;
  (((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
     *)&(((Function *)local_98._0_8_)->params_).
        super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
  super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>)._M_head_impl = (Instruction *)bb;
  (((Function *)local_98._0_8_)->params_).
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pFVar15;
  (((Function *)local_98._0_8_)->params_).
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pIVar1;
  local_98._24_8_ =
       std::
       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:257:22)>
       ::_M_invoke;
  local_98._16_8_ =
       std::
       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:257:22)>
       ::_M_manager;
  local_c0 = (undefined1  [8])0x0;
  local_c8 = (undefined1  [8])local_98;
  local_b8._8_8_ =
       std::
       _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
       ::_M_invoke;
  local_b8._0_8_ =
       std::
       _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
       ::_M_manager;
  pIVar12 = (bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_50 = (Function *)_Var30._M_head_impl;
  if ((pIVar12 != (Instruction *)0x0) &&
     ((pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar12 == (Instruction *)0x0) break;
      pIVar31 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pIVar31->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar31 = (Instruction *)0x0;
      }
      if (pIVar12->opcode_ != OpPhi) break;
      local_60._M_array = (iterator)pIVar12;
      if ((PodType  [2])local_b8._0_8_ == (PodType  [2])0x0) {
LAB_0056e076:
        std::__throw_bad_function_call();
      }
      cVar8 = (*(code *)local_b8._8_8_)(local_c8,&local_60);
      pIVar12 = pIVar31;
    } while (cVar8 != '\0');
    pCVar26 = local_d0;
    if ((PodType  [2])local_b8._0_8_ == (PodType  [2])0x0) goto LAB_0056db40;
  }
  (*(code *)local_b8._0_8_)(local_c8,local_c8,3);
LAB_0056db40:
  if ((PodType  [2])local_98._16_8_ != (PodType  [2])0x0) {
    (*(code *)local_98._16_8_)(local_98,local_98,3);
  }
  local_6c[2] = 0xf9;
  aVar11._M_elems[0] = '\0';
  aVar11._M_elems[1] = '\0';
  aVar11._M_elems[2] = '\0';
  aVar11._M_elems[3] = '\0';
  local_6c[1] = 0;
  local_6c[0] = 0;
  pIVar12 = *(Instruction **)
             &((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&pFVar15->params_)->_M_t;
  if (pIVar12->has_result_id_ == true) {
    aVar11._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  local_98._24_8_ = local_98 + 0x10;
  local_98._0_8_ = &PTR__SmallVector_00930a20;
  local_78._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_98._16_4_ = aVar11._M_elems;
  local_98._8_8_ = (Instruction *)0x1;
  local_c8._0_4_ = 1;
  local_c0 = (undefined1  [8])&PTR__SmallVector_00930a20;
  local_b8._0_4_ = (array<signed_char,_4UL>)0x0;
  local_b8._4_4_ = (array<signed_char,_4UL>)0x0;
  local_a8._M_head_impl =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_b8 + 8);
  local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_c0,(SmallVector<unsigned_int,_2UL> *)local_98);
  local_60._M_array = (iterator)local_c8;
  local_60._M_len = 1;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*&,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&local_40,&local_d8,(Op *)(local_6c + 2),local_6c + 1,local_6c,&local_60);
  node = local_40;
  local_40 = (pointer)0x0;
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>,node);
  if (local_40 != (pointer)0x0) {
    (*(local_40->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])();
  }
  local_40 = (pointer)0x0;
  local_c0 = (undefined1  [8])&PTR__SmallVector_00930a20;
  if (local_a0._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_a0,local_a0._M_head_impl);
  }
  local_a0._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_98._0_8_ = &PTR__SmallVector_00930a20;
  if ((IRContext *)local_78._M_head_impl != (IRContext *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_78,local_78._M_head_impl);
  }
  this_01 = local_50;
  pIVar12 = (Instruction *)
            (local_48->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase;
  if ((pIVar12 != (Instruction *)0x0) &&
     ((pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    IRContext::AnalyzeUses
              (local_d8,(bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                        super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
    pIVar12 = (bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar12 != (Instruction *)0x0) &&
       ((pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
      local_c8 = (undefined1  [8])
                 (bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
      if ((local_d8->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
        ppBVar16 = std::__detail::
                   _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_d8->instr_to_block_,(key_type *)local_c8);
        *ppBVar16 = bb;
      }
      this_02 = &pCVar26->label2preds_;
      pIVar12 = *(Instruction **)
                 &((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)&pFVar15->params_)->_M_t;
      uVar10 = 0;
      uVar9 = 0;
      if (pIVar12->has_result_id_ == true) {
        uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
      }
      local_c8._0_4_ = uVar9;
      pmVar17 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_02,(key_type *)local_c8);
      pIVar12 = (bb->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar12->has_result_id_ == true) {
        uVar10 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
      }
      local_98._0_4_ = uVar10;
      iVar5._M_current =
           (pmVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (pmVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (pmVar17,iVar5,(uint *)local_98);
      }
      else {
        *iVar5._M_current = uVar10;
        (pmVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_c0._4_4_ = 0;
      local_c0._0_4_ = label_id.data._M_elems;
      local_b8._8_8_ =
           std::
           _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:315:38)>
           ::_M_invoke;
      local_b8._0_8_ =
           std::
           _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp:315:38)>
           ::_M_manager;
      local_c8 = (undefined1  [8])bb;
      BasicBlock::ForEachSuccessorLabel
                ((BasicBlock *)this_01,(function<void_(unsigned_int_*)> *)local_c8);
      if ((PodType  [2])local_b8._0_8_ != (PodType  [2])0x0) {
        (*(code *)local_b8._0_8_)(local_c8,local_c8,3);
      }
      pp_Var6 = (this_01->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
                _vptr_IntrusiveList;
      if ((pp_Var6 != (_func_int **)0x0) && (*(char *)(pp_Var6 + 3) == '\0')) {
        IRContext::AnalyzeUses
                  (local_d8,(Instruction *)
                            (this_01->debug_insts_in_header_).
                            super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                            super_IntrusiveNodeBase<spvtools::opt::Instruction>.
                            _vptr_IntrusiveNodeBase);
        pIVar12 = *(Instruction **)
                   &((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      *)&pFVar15->params_)->_M_t;
        uVar10 = 0;
        uVar9 = 0;
        if (pIVar12->has_result_id_ == true) {
          uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
        }
        local_c8._0_4_ = uVar9;
        pmVar17 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_02,(key_type *)local_c8);
        pIVar12 = (Instruction *)
                  (this_01->params_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pIVar12->has_result_id_ == true) {
          uVar10 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
        }
        local_98._0_4_ = uVar10;
        iVar5._M_current =
             (pmVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (pmVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (pmVar17,iVar5,(uint *)local_98);
        }
        else {
          *iVar5._M_current = uVar10;
          (pmVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        pIVar12 = (bb->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar10 = 0;
        uVar9 = 0;
        if (pIVar12->has_result_id_ == true) {
          uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
        }
        local_c8._0_4_ = uVar9;
        pmVar17 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_02,(key_type *)local_c8);
        puVar25 = (pmVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        puVar3 = (pmVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pIVar12 = (Instruction *)
                  (local_50->params_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pIVar12->has_result_id_ == true) {
          uVar10 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
        }
        local_c8._0_4_ = uVar10;
        __dest = std::
                 __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                           (puVar25,puVar3);
        puVar25 = (pmVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_finish;
        if (__dest._M_current == puVar25) {
          __assert_fail("latch_pos != block_preds.end() && \"The cfg was invalid.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/cfg.cpp"
                        ,0x147,"BasicBlock *spvtools::opt::CFG::SplitLoopHeader(BasicBlock *)");
        }
        puVar3 = __dest._M_current + 1;
        if (puVar3 != puVar25) {
          memmove(__dest._M_current,puVar3,(long)puVar25 - (long)puVar3);
          puVar25 = (pmVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        (pmVar17->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = puVar25 + -1;
        if ((local_d8->valid_analyses_ & kAnalysisLoopAnalysis) == kAnalysisNone) {
          return (BasicBlock *)pFVar15;
        }
        pLVar18 = IRContext::GetLoopDescriptor(local_d8,bb->function_);
        pIVar12 = (bb->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar9 = 0;
        if (pIVar12->has_result_id_ == true) {
          uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
        }
        local_c8._0_4_ = uVar9;
        cVar19 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(pLVar18->basic_block_to_loop_)._M_h,(key_type *)local_c8);
        if (cVar19.
            super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false>.
            _M_cur == (__node_type *)0x0) {
          pLVar32 = (Loop *)0x0;
        }
        else {
          pLVar32 = *(Loop **)((long)cVar19.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false>
                                     ._M_cur + 0x10);
        }
        local_98._0_4_ = label_id.data._M_elems;
        pLVar29 = pLVar32;
        local_d0 = (CFG *)&pLVar18->basic_block_to_loop_;
        do {
          local_c8 = (undefined1  [8])&pLVar29->loop_basic_blocks_;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_c8,local_98,local_c8);
          pLVar29 = pLVar29->parent_;
        } while (pLVar29 != (Loop *)0x0);
        pLVar32->loop_header_ = (BasicBlock *)pFVar15;
        local_c8._0_4_ = label_id.data._M_elems;
        ppLVar20 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_d0,(key_type *)local_c8);
        *ppLVar20 = pLVar32;
        pIVar12 = (bb->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar9 = 0;
        if (pIVar12->has_result_id_ == true) {
          uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
        }
        local_c8._0_4_ = uVar9;
        pLVar29 = pLVar32;
        do {
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(&(pLVar29->loop_basic_blocks_)._M_h,local_c8);
          pLVar29 = pLVar29->parent_;
        } while (pLVar29 != (Loop *)0x0);
        Loop::SetPreHeaderBlock(pLVar32,bb);
        pLVar7 = pLVar32->parent_;
        pIVar12 = (bb->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar9 = 0;
        if (pLVar7 == (mapped_type)0x0) {
          if (pIVar12->has_result_id_ != false) {
            uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
          }
          local_c8._0_4_ = uVar9;
          ppLVar20 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_d0,(key_type *)local_c8);
          *ppLVar20 = (mapped_type)0x0;
          return (BasicBlock *)pFVar15;
        }
        if (pIVar12->has_result_id_ != false) {
          uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
        }
        local_98._0_4_ = uVar9;
        pLVar32 = pLVar7;
        do {
          local_c8 = (undefined1  [8])&pLVar32->loop_basic_blocks_;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_c8,local_98,local_c8);
          pLVar32 = pLVar32->parent_;
        } while (pLVar32 != (Loop *)0x0);
        pIVar12 = (bb->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar9 = 0;
        if (pIVar12->has_result_id_ == true) {
          uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
        }
        local_c8._0_4_ = uVar9;
        ppLVar20 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_d0,(key_type *)local_c8);
        *ppLVar20 = pLVar7;
        return (BasicBlock *)pFVar15;
      }
    }
  }
  __assert_fail("!insts_.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
}

Assistant:

BasicBlock* CFG::SplitLoopHeader(BasicBlock* bb) {
  assert(bb->GetLoopMergeInst() && "Expecting bb to be the header of a loop.");

  Function* fn = bb->GetParent();
  IRContext* context = module_->context();

  // Get the new header id up front.  If we are out of ids, then we cannot split
  // the loop.
  uint32_t new_header_id = context->TakeNextId();
  if (new_header_id == 0) {
    return nullptr;
  }

  // Find the insertion point for the new bb.
  Function::iterator header_it = std::find_if(
      fn->begin(), fn->end(),
      [bb](BasicBlock& block_in_func) { return &block_in_func == bb; });
  assert(header_it != fn->end());

  const std::vector<uint32_t>& pred = preds(bb->id());
  // Find the back edge
  BasicBlock* latch_block = nullptr;
  Function::iterator latch_block_iter = header_it;
  for (; latch_block_iter != fn->end(); ++latch_block_iter) {
    // If blocks are in the proper order, then the only branch that appears
    // after the header is the latch.
    if (std::find(pred.begin(), pred.end(), latch_block_iter->id()) !=
        pred.end()) {
      break;
    }
  }
  assert(latch_block_iter != fn->end() && "Could not find the latch.");
  latch_block = &*latch_block_iter;

  RemoveSuccessorEdges(bb);

  // Create the new header bb basic bb.
  // Leave the phi instructions behind.
  auto iter = bb->begin();
  while (iter->opcode() == spv::Op::OpPhi) {
    ++iter;
  }

  BasicBlock* new_header = bb->SplitBasicBlock(context, new_header_id, iter);
  context->AnalyzeDefUse(new_header->GetLabelInst());

  // Update cfg
  RegisterBlock(new_header);

  // Update bb mappings.
  context->set_instr_block(new_header->GetLabelInst(), new_header);
  new_header->ForEachInst([new_header, context](Instruction* inst) {
    context->set_instr_block(inst, new_header);
  });

  // If |bb| was the latch block, the branch back to the header is not in
  // |new_header|.
  if (latch_block == bb) {
    if (new_header->ContinueBlockId() == bb->id()) {
      new_header->GetLoopMergeInst()->SetInOperand(1, {new_header_id});
    }
    latch_block = new_header;
  }

  // Adjust the OpPhi instructions as needed.
  bb->ForEachPhiInst([latch_block, bb, new_header, context](Instruction* phi) {
    std::vector<uint32_t> preheader_phi_ops;
    std::vector<Operand> header_phi_ops;

    // Identify where the original inputs to original OpPhi belong: header or
    // preheader.
    for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
      uint32_t def_id = phi->GetSingleWordInOperand(i);
      uint32_t branch_id = phi->GetSingleWordInOperand(i + 1);
      if (branch_id == latch_block->id()) {
        header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {def_id}});
        header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {branch_id}});
      } else {
        preheader_phi_ops.push_back(def_id);
        preheader_phi_ops.push_back(branch_id);
      }
    }

    // Create a phi instruction if and only if the preheader_phi_ops has more
    // than one pair.
    if (preheader_phi_ops.size() > 2) {
      InstructionBuilder builder(
          context, &*bb->begin(),
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

      Instruction* new_phi = builder.AddPhi(phi->type_id(), preheader_phi_ops);

      // Add the OpPhi to the header bb.
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {new_phi->result_id()}});
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {bb->id()}});
    } else {
      // An OpPhi with a single entry is just a copy.  In this case use the same
      // instruction in the new header.
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {preheader_phi_ops[0]}});
      header_phi_ops.push_back({SPV_OPERAND_TYPE_ID, {bb->id()}});
    }

    phi->RemoveFromList();
    std::unique_ptr<Instruction> phi_owner(phi);
    phi->SetInOperands(std::move(header_phi_ops));
    new_header->begin()->InsertBefore(std::move(phi_owner));
    context->set_instr_block(phi, new_header);
    context->AnalyzeUses(phi);
  });

  // Add a branch to the new header.
  InstructionBuilder branch_builder(
      context, bb,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  bb->AddInstruction(
      MakeUnique<Instruction>(context, spv::Op::OpBranch, 0, 0,
                              std::initializer_list<Operand>{
                                  {SPV_OPERAND_TYPE_ID, {new_header->id()}}}));
  context->AnalyzeUses(bb->terminator());
  context->set_instr_block(bb->terminator(), bb);
  label2preds_[new_header->id()].push_back(bb->id());

  // Update the latch to branch to the new header.
  latch_block->ForEachSuccessorLabel([bb, new_header_id](uint32_t* id) {
    if (*id == bb->id()) {
      *id = new_header_id;
    }
  });
  Instruction* latch_branch = latch_block->terminator();
  context->AnalyzeUses(latch_branch);
  label2preds_[new_header->id()].push_back(latch_block->id());

  auto& block_preds = label2preds_[bb->id()];
  auto latch_pos =
      std::find(block_preds.begin(), block_preds.end(), latch_block->id());
  assert(latch_pos != block_preds.end() && "The cfg was invalid.");
  block_preds.erase(latch_pos);

  // Update the loop descriptors
  if (context->AreAnalysesValid(IRContext::kAnalysisLoopAnalysis)) {
    LoopDescriptor* loop_desc = context->GetLoopDescriptor(bb->GetParent());
    Loop* loop = (*loop_desc)[bb->id()];

    loop->AddBasicBlock(new_header_id);
    loop->SetHeaderBlock(new_header);
    loop_desc->SetBasicBlockToLoop(new_header_id, loop);

    loop->RemoveBasicBlock(bb->id());
    loop->SetPreHeaderBlock(bb);

    Loop* parent_loop = loop->GetParent();
    if (parent_loop != nullptr) {
      parent_loop->AddBasicBlock(bb->id());
      loop_desc->SetBasicBlockToLoop(bb->id(), parent_loop);
    } else {
      loop_desc->SetBasicBlockToLoop(bb->id(), nullptr);
    }
  }
  return new_header;
}